

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

int __thiscall re2c::OutputFile::open(OutputFile *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  
  if (this->file_name == (char *)0x0) {
    this->file_name = "<stdout>";
    pFVar1 = _stdout;
  }
  else {
    pFVar1 = fopen(this->file_name,"wb");
  }
  this->file = (FILE *)pFVar1;
  return (int)CONCAT71((int7)((ulong)pFVar1 >> 8),pFVar1 != (FILE *)0x0);
}

Assistant:

bool OutputFile::open ()
{
	if (file_name == NULL)
	{
		file_name = "<stdout>";
		file = stdout;
	}
	else
	{
		file = fopen (file_name, "wb");
	}
	return file != NULL;
}